

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::schema::Node::Builder::initStruct(Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<6u>();
  _::StructBuilder::setDataField<capnp::schema::Node::Which>(&this->_builder,uVar1,STRUCT);
  uVar1 = bounded<7u>();
  _::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = bounded<12u>();
  _::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = bounded<13u>();
  _::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = bounded<224u>();
  _::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<15u>();
  _::StructBuilder::setDataField<unsigned_short>(&this->_builder,uVar1,0);
  uVar1 = bounded<8u>();
  _::StructBuilder::setDataField<unsigned_int>(&this->_builder,uVar1,0);
  uVar1 = bounded<3u>();
  _::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  _::PointerBuilder::clear(&local_28);
  memcpy(&local_50,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_48;
  base.segment = (SegmentBuilder *)local_50;
  base.data = (void *)local_40;
  base.pointers = (WirePointer *)uStack_38;
  base.dataSize = (undefined4)local_30;
  base.pointerCount = local_30._4_2_;
  base._38_2_ = local_30._6_2_;
  Struct::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename Node::Struct::Builder Node::Builder::initStruct() {
  _builder.setDataField<Node::Which>(
      ::capnp::bounded<6>() * ::capnp::ELEMENTS, Node::STRUCT);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<7>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<12>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<13>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<224>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint16_t>(::capnp::bounded<15>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField< ::uint32_t>(::capnp::bounded<8>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<3>() * ::capnp::POINTERS).clear();
  return typename Node::Struct::Builder(_builder);
}